

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismsnoop.cpp
# Opt level: O3

ISMSnoopInstrument * ismsnoop_open(char *path)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *this;
  FileVersion file_version;
  _Ios_Seekdir _Var3;
  DataType DVar4;
  long lVar5;
  ISMSnoopInstrument *pIVar6;
  long local_2a8;
  ifstream ifs;
  int aiStack_288 [122];
  ISMSnoopInstrument *local_a0;
  string *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  shared_ptr<ismsnoop::VersionHandler> handler;
  uint32_t file_name_length;
  undefined1 local_70 [8];
  pointer pcStack_68;
  pointer local_60;
  undefined1 local_58 [8];
  uint16_t width;
  ushort local_3a;
  uint local_38;
  uint16_t depth;
  uint16_t height;
  char magic_byte;
  
  std::ifstream::ifstream(&local_2a8,path,_S_in|_S_bin);
  if (*(int *)((long)aiStack_288 + *(long *)(local_2a8 + -0x18)) == 0) {
    std::istream::seekg((long)&local_2a8,_S_beg);
    lVar5 = std::istream::tellg();
    if (0x23 < lVar5) {
      file_version = ismsnoop::read_file_version((ifstream *)&local_2a8);
      ismsnoop::make_handler((ismsnoop *)&local_90,file_version);
      ismsnoop::VersionHandler::find_panel_icon((VersionHandler *)local_90,(ifstream *)&local_2a8);
      pIVar6 = (ISMSnoopInstrument *)operator_new(0x48);
      (pIVar6->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pIVar6->name)._M_dataplus._M_p = (pointer)0x0;
      (pIVar6->name)._M_string_length = 0;
      (pIVar6->name).field_2._M_allocated_capacity = 0;
      (pIVar6->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar6->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar6->panel_icon).width = 0;
      (pIVar6->panel_icon).height = 0;
      *(undefined8 *)&(pIVar6->panel_icon).depth = 0;
      *(undefined8 *)((long)&(pIVar6->name).field_2 + 8) = 0;
      (pIVar6->name)._M_dataplus._M_p = (pointer)&(pIVar6->name).field_2;
      (pIVar6->name).field_2._M_local_buf[0] = '\0';
      std::istream::get((char *)&local_2a8);
      if (depth._1_1_ == '\0') {
        (pIVar6->panel_icon).width = 0;
        (pIVar6->panel_icon).height = 0;
        (pIVar6->panel_icon).depth = 0;
        std::istream::seekg((long)&local_2a8,_S_end|_S_cur);
      }
      else {
        std::istream::seekg((long)&local_2a8,7);
        ismsnoop::read_panel_icon
                  ((InstrumentImage *)
                   &handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(ifstream *)&local_2a8);
        (pIVar6->panel_icon).depth = file_name_length;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pIVar6->panel_icon =
             handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        pcVar1 = (pIVar6->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (pIVar6->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_70;
        (pIVar6->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcStack_68;
        (pIVar6->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_60;
        local_70 = (undefined1  [8])0x0;
        pcStack_68 = (pointer)0x0;
        local_60 = (pointer)0x0;
        if ((pcVar1 != (pointer)0x0) && (operator_delete(pcVar1), local_70 != (undefined1  [8])0x0))
        {
          operator_delete((void *)local_70);
        }
      }
      local_98 = (string *)&pIVar6->name;
      local_a0 = pIVar6;
      do {
        while( true ) {
          this = handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
          p_Var2 = local_90;
          if (handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&handler.
                       super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr[1]._vptr_VersionHandler =
                   *(int *)&handler.
                            super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr[1]._vptr_VersionHandler + 1;
              UNLOCK();
            }
            else {
              *(int *)&handler.
                       super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr[1]._vptr_VersionHandler =
                   *(int *)&handler.
                            super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr[1]._vptr_VersionHandler + 1;
            }
          }
          _Var3 = std::istream::tellg();
          handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var2;
          if (this != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&this[1]._vptr_VersionHandler = *(int *)&this[1]._vptr_VersionHandler + 1;
              UNLOCK();
            }
            else {
              *(int *)&this[1]._vptr_VersionHandler = *(int *)&this[1]._vptr_VersionHandler + 1;
            }
          }
          DVar4 = ismsnoop::find_data((ifstream *)&local_2a8,0,
                                      (shared_ptr<ismsnoop::VersionHandler> *)
                                      &handler.
                                       super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
          if (this != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          }
          if (DVar4 == None) {
            std::istream::seekg((long)&local_2a8,_Var3);
            local_58 = (undefined1  [8])p_Var2;
            _width = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
            if (this != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&this[1]._vptr_VersionHandler = *(int *)&this[1]._vptr_VersionHandler + 1;
                UNLOCK();
              }
              else {
                *(int *)&this[1]._vptr_VersionHandler = *(int *)&this[1]._vptr_VersionHandler + 1;
              }
            }
            DVar4 = ismsnoop::find_data((ifstream *)&local_2a8,2,
                                        (shared_ptr<ismsnoop::VersionHandler> *)local_58);
            if (_width != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_width);
            }
          }
          if (this != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          }
          if (DVar4 != BackgroundImage) break;
          std::istream::read((char *)&local_2a8,
                             (long)&handler.
                                    super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          std::istream::seekg((long)&local_2a8,
                              (int)handler.
                                   super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 0x2d);
          std::istream::read((char *)&local_2a8,(long)local_58);
          std::istream::read((char *)&local_2a8,(long)&local_38);
          std::istream::read((char *)&local_2a8,(long)&local_3a);
          std::istream::seekg((long)&local_2a8,
                              (local_38 & 0xffff) * (uint)(ushort)local_58._0_2_ *
                              (uint)(local_3a >> 3));
        }
        if (DVar4 == None) goto LAB_00104c65;
      } while (DVar4 != InfoText);
      std::istream::read((char *)&local_2a8,(long)&local_38);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_58,(ulong)local_38,
                 (allocator_type *)
                 &handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::istream::read((char *)&local_2a8,(long)local_58);
      handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)
                 &handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,local_58,_width);
      std::__cxx11::string::operator=
                (local_98,(string *)
                          &handler.
                           super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      if (handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70) {
        operator_delete(handler.
                        super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
      }
      if (local_58 != (undefined1  [8])0x0) {
        operator_delete((void *)local_58);
      }
LAB_00104c65:
      pIVar6 = local_a0;
      if (handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        pIVar6 = local_a0;
      }
      goto LAB_0010492d;
    }
  }
  pIVar6 = (ISMSnoopInstrument *)0x0;
LAB_0010492d:
  std::ifstream::~ifstream(&local_2a8);
  return pIVar6;
}

Assistant:

ISMSnoopInstrument * ismsnoop_open(const char * path)
{
	std::ifstream ifs(path, std::ios_base::in | std::ios_base::binary);

	if(!ifs.good())
	{
		return nullptr;
	}

	ifs.seekg(0, std::ios::end);

	const auto file_length = ifs.tellg();

	if(file_length < ismsnoop::VERSION_INFO)
	{
		return nullptr;
	}

	const auto handler = make_handler(ismsnoop::read_file_version(ifs));

	handler->find_panel_icon(ifs);

	const auto result = new ISMSnoopInstrument();

	char magic_byte;

	ifs.get(magic_byte);

	if (magic_byte == 0)
	{
		// no panel icon
		result->panel_icon.width = 0;
		result->panel_icon.height = 0;
		result->panel_icon.depth = 0;

		ifs.seekg(3, std::ios::cur);
	}
	else
	{
		ifs.seekg(7, std::ios::cur);

		result->panel_icon = ismsnoop::read_panel_icon(ifs);
	}

	ismsnoop::DataType data_type;

	//while (!ifs.eof())
	while ((data_type = find_data(ifs, handler)) != ismsnoop::DataType::None)
	{
		//data_type = find_data(ifs);
		switch (data_type)
		{
			case ismsnoop::DataType::BackgroundImage:
			{
				uint32_t file_name_length;

				ifs.read((char*)(&file_name_length), 4);

				ifs.seekg(45 + file_name_length, std::ios::cur);

				uint16_t width, height, depth;

				ifs.read((char*)(&width), 2);
				ifs.read((char*)(&height), 2);
				ifs.read((char*)(&depth), 2);

				const auto channels = depth / 8;
				const auto image_size = width * height * channels;

				ifs.seekg(image_size, std::ios::cur);

				break;
			}

			case ismsnoop::DataType::InfoText:
			{
				uint32_t name_length;

				ifs.read((char*)(&name_length), 4);

				std::vector<char> buffer(name_length);

				ifs.read(buffer.data(), name_length);

				result->name = std::string(buffer.begin(), buffer.end());

				return result;
			}

			default:
			{
				break;
			}
		}
	}

	return result;
}